

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Processor * __thiscall
soul::ResolutionPass::ModuleInstanceResolver::visitModule<soul::AST::Processor>
          (ModuleInstanceResolver *this,Processor *m)

{
  pointer ppVar1;
  Processor *pPVar2;
  pool_ref<soul::AST::ASTObject> *p;
  pointer ppVar3;
  
  if ((m->super_ProcessorBase).super_ModuleBase.specialisationParams.
      super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (m->super_ProcessorBase).super_ModuleBase.specialisationParams.
      super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    RewritingASTVisitor::
    visitArray<std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
              ((RewritingASTVisitor *)this,
               &(m->super_ProcessorBase).super_ModuleBase.specialisationParams);
    ppVar1 = (m->super_ProcessorBase).super_ModuleBase.specialisationParams.
             super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (m->super_ProcessorBase).super_ModuleBase.specialisationParams.
                  super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      validateSpecialisationParam
                (this,ppVar3->object,(this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors);
    }
    return m;
  }
  pPVar2 = RewritingASTVisitor::visit((RewritingASTVisitor *)this,m);
  return pPVar2;
}

Assistant:

M& visitModule (M& m)
        {
            if (! m.isTemplateModule())
                return super::visit (m);

            visitArray (m.specialisationParams);

            for (auto& p : m.specialisationParams)
                validateSpecialisationParam (p, ignoreErrors);

            return m;
        }